

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

BinaryConditionalDirectiveExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryConditionalDirectiveExpressionSyntax,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&>
          (BumpAllocator *this,ConditionalDirectiveExpressionSyntax *args,Token *args_1,
          ConditionalDirectiveExpressionSyntax *args_2)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  BinaryConditionalDirectiveExpressionSyntax *pBVar6;
  
  pBVar6 = (BinaryConditionalDirectiveExpressionSyntax *)allocate(this,0x38,8);
  TVar2 = args_1->kind;
  uVar3 = args_1->field_0x2;
  NVar4.raw = (args_1->numFlags).raw;
  uVar5 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pBVar6->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind =
       BinaryConditionalDirectiveExpression;
  (pBVar6->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pBVar6->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pBVar6->left).ptr = args;
  (pBVar6->op).kind = TVar2;
  (pBVar6->op).field_0x2 = uVar3;
  (pBVar6->op).numFlags = (NumericTokenFlags)NVar4.raw;
  (pBVar6->op).rawLen = uVar5;
  (pBVar6->op).info = pIVar1;
  (pBVar6->right).ptr = args_2;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pBVar6;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pBVar6;
  return pBVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }